

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int SPRKStepReInit(void *arkode_mem,ARKRhsFn f1,ARKRhsFn f2,sunrealtype t0,N_Vector y0)

{
  long in_RCX;
  sunrealtype in_RDX;
  ARKodeMem in_RSI;
  N_Vector in_XMM0_Qa;
  int retval;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffb8;
  long lVar1;
  ARKodeMem ark_mem_00;
  uint local_4;
  
  ark_mem_00 = (ARKodeMem)0x0;
  lVar1 = 0;
  local_4 = sprkStep_AccessARKODEStepMem
                      ((void *)0x0,(char *)0x0,(ARKodeMem *)(ulong)in_stack_ffffffffffffffb8,
                       (ARKodeSPRKStepMem *)0x198d83);
  if (local_4 == 0) {
    if (ark_mem_00->MallocDone == 0) {
      arkProcessError(ark_mem_00,-0x17,0xb9,"SPRKStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else if ((in_RSI == (ARKodeMem)0x0) || (in_RDX == 0.0)) {
      arkProcessError(ark_mem_00,-0x16,0xc1,"SPRKStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"Must specify at least one of fe, fi (both NULL).");
      local_4 = 0xffffffea;
    }
    else if (in_RCX == 0) {
      arkProcessError(ark_mem_00,-0x16,0xc9,"SPRKStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"y0 = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else {
      *(ARKodeMem *)(lVar1 + 0x20) = in_RSI;
      *(sunrealtype *)(lVar1 + 0x28) = in_RDX;
      local_4 = arkInit(in_RSI,in_RDX,in_XMM0_Qa,(int)((ulong)in_RCX >> 0x20));
      if (local_4 == 0) {
        *(undefined8 *)(lVar1 + 0x30) = 0;
        *(undefined8 *)(lVar1 + 0x38) = 0;
        *(undefined4 *)(lVar1 + 0x40) = 0;
        if (ark_mem_00->use_compensated_sums != 0) {
          N_VConst(0,*(undefined8 *)(lVar1 + 0x18));
        }
        local_4 = 0;
      }
      else {
        arkProcessError(ark_mem_00,(int)(ulong)local_4,0xd6,"SPRKStepReInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                        ,"Unable to reinitialize main ARKODE infrastructure");
      }
    }
  }
  return local_4;
}

Assistant:

int SPRKStepReInit(void* arkode_mem, ARKRhsFn f1, ARKRhsFn f2, sunrealtype t0,
                   N_Vector y0)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* access ARKodeMem and ARKodeSPRKStepMem structures */
  retval = sprkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check that f1 and f2 are supplied */
  if (!f1 || !f2)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (!y0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->f1 = f1;
  step_mem->f2 = f2;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to reinitialize main ARKODE infrastructure");
    return (retval);
  }

  /* Initialize the counters */
  step_mem->nf1    = 0;
  step_mem->nf2    = 0;
  step_mem->istage = 0;

  /* Zero yerr for compensated summation */
  if (ark_mem->use_compensated_sums) { N_VConst(ZERO, step_mem->yerr); }

  return (ARK_SUCCESS);
}